

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * declarator(dmr_C *C,token *token,decl_state *ctx)

{
  byte *pbVar1;
  uchar uVar2;
  _func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *p_Var3;
  global_symbols_t *pgVar4;
  symbol *psVar5;
  anon_union_136_3_e2189aaa_for_symbol_15 *paVar6;
  decl_state *pdVar7;
  int iVar8;
  symbol *psVar9;
  char *pcVar10;
  token *ptVar11;
  position pVar12;
  anon_union_8_7_c7bfca54_for_token_2 *paVar13;
  uint uVar14;
  uint uVar15;
  dmr_C *C_00;
  decl_state *pdVar16;
  undefined4 uStack_88;
  undefined4 uStack_84;
  expression *expr;
  undefined4 local_78;
  undefined4 uStack_74;
  uint uStack_70;
  undefined4 uStack_6c;
  symbol *local_68;
  ident **ppiStack_60;
  symbol_op *local_58;
  uchar uStack_50;
  uchar uStack_4f;
  byte bStack_4e;
  uchar uStack_4d;
  undefined4 uStack_4c;
  symbol *local_48;
  int local_3c;
  anon_union_8_7_c7bfca54_for_token_2 *local_38;
  
  pVar12 = token->pos;
  if ((pVar12._0_4_ & 0x3f) == 0x11) {
    do {
      if ((token->field_2).special != 0x2a) break;
      psVar9 = dmrC_alloc_symbol(C->S,pVar12,4);
      (psVar9->field_14).field_2.ctype.modifiers = (ctx->ctype).modifiers;
      (psVar9->field_14).field_2.ctype.base_type = (ctx->ctype).base_type;
      *(uint *)((long)&psVar9->field_14 + 0x30) = (ctx->ctype).as;
      (psVar9->field_14).field_2.ctype.contexts = (ctx->ctype).contexts;
      (ctx->ctype).modifiers = 0;
      (ctx->ctype).base_type = psVar9;
      (ctx->ctype).alignment = 0;
      (ctx->ctype).contexts = (context_list *)0x0;
      (ctx->ctype).as = 0;
      token = token->next;
      pVar12 = token->pos;
      if ((pVar12._0_4_ & 0x3f) == 2) {
        do {
          psVar9 = dmrC_lookup_symbol((token->field_2).ident,NS_TYPEDEF);
          if (((psVar9 == (symbol *)0x0) || (*(char *)psVar9 != '\x11')) ||
             ((psVar9->op->type & (KW_ATTRIBUTE|KW_QUALIFIER)) == 0)) break;
          token = token->next;
          p_Var3 = psVar9->op->declarator;
          if (p_Var3 != (_func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *)0x0) {
            token = (*p_Var3)(C,token,ctx);
          }
        } while (((ulong)token->pos & 0x3f) == 2);
        psVar9 = (ctx->ctype).base_type;
        pVar12 = token->pos;
      }
      psVar9->endpos = pVar12;
      pVar12 = token->pos;
    } while ((pVar12._0_4_ & 0x3f) == 0x11);
  }
  paVar13 = (anon_union_8_7_c7bfca54_for_token_2 *)ctx->ident;
  uVar14 = pVar12._0_4_ & 0x3f;
  pdVar16 = ctx;
  if ((paVar13 == (anon_union_8_7_c7bfca54_for_token_2 *)0x0) || (uVar14 != 2)) {
    if ((uVar14 == 0x11) && ((token->field_2).special == 0x28)) {
      uVar2 = ctx->prefer_abstract;
      local_38 = paVar13;
      ptVar11 = skip_attributes(C,token->next);
      uVar14 = SUB84(ptVar11->pos,0) & 0x3f;
      if (uVar14 == 0x11) {
        paVar13 = local_38;
        if (((ptVar11->field_2).special == 0x29) || ((ptVar11->field_2).special == 0x117))
        goto LAB_00118433;
      }
      else if ((uVar14 == 2) &&
              (((psVar9 = dmrC_lookup_symbol((ptVar11->field_2).ident,NS_SYMBOL|NS_TYPEDEF),
                psVar9 != (symbol *)0x0 && ((psVar9->field_0x1 & 2) != 0)) &&
               (paVar13 = local_38, uVar2 != '\0')))) goto LAB_00118433;
      psVar9 = (ctx->ctype).base_type;
      if (token->next != ptVar11) {
        ptVar11 = handle_attributes(C,token->next,ctx,8);
      }
      ptVar11 = declarator(C,ptVar11,ctx);
      token = dmrC_expect_token(C,ptVar11,0x29,"in nested declarator");
      paVar13 = (anon_union_8_7_c7bfca54_for_token_2 *)0x0;
      pdVar7 = ctx;
      do {
        pdVar16 = pdVar7;
        psVar5 = (pdVar16->ctype).base_type;
        pdVar7 = (decl_state *)&(psVar5->field_14).field_2.ctype;
      } while (psVar5 != psVar9);
    }
  }
  else {
    *paVar13 = token->field_2;
    token = token->next;
  }
LAB_00118433:
  pVar12 = token->pos;
  if ((pVar12._0_4_ & 0x3f) == 0x11) {
    if ((token->field_2).special == 0x28) {
      ptVar11 = token->next;
      uVar15 = SUB84(ptVar11->pos,0);
      uVar14 = uVar15 & 0x3f;
      if (uVar14 == 0x11) {
        if ((ptVar11->field_2).special == 0x117) {
          dmrC_warning(C,ptVar11->pos,"variadic functions must have one named argument");
          iVar8 = 2;
        }
        else {
          iVar8 = 3;
          if ((ptVar11->field_2).special == 0x29) {
            iVar8 = 0;
            if ((paVar13 != (anon_union_8_7_c7bfca54_for_token_2 *)0x0) &&
               ((((ulong)ptVar11->next->pos & 0x3f) != 0x11 ||
                (iVar8 = 0, (ptVar11->next->field_2).special != 0x3b)))) {
              pcVar10 = dmrC_show_ident(C,paVar13->ident);
              iVar8 = 0;
              dmrC_warning(C,ptVar11->pos,"non-ANSI function declaration of function \'%s\'",pcVar10
                          );
            }
          }
        }
      }
      else {
        iVar8 = 3;
        if ((uVar14 == 2) &&
           ((((uVar2 = ctx->prefer_abstract, (uVar15 & 0x3f) != 2 ||
              (psVar9 = dmrC_lookup_symbol((ptVar11->field_2).ident,NS_SYMBOL|NS_TYPEDEF),
              psVar9 == (symbol *)0x0)) || (iVar8 = 2, (psVar9->field_0x1 & 2) == 0)) &&
            (iVar8 = 1, uVar2 != '\0')))) {
          dmrC_warning(C,token->pos,"identifier list not in definition");
        }
      }
      local_48 = dmrC_alloc_symbol(C->S,token->pos,5);
      (local_48->field_14).field_2.ctype.base_type = (pdVar16->ctype).base_type;
      (local_48->field_14).field_2.ctype.modifiers = (pdVar16->ctype).modifiers;
      (pdVar16->ctype).base_type = local_48;
      (pdVar16->ctype).modifiers = 0;
      ptVar11 = token->next;
      if (iVar8 == 2) {
        local_38 = (anon_union_8_7_c7bfca54_for_token_2 *)((long)&local_48->field_14 + 0x40);
        for (; ((SUB84(ptVar11->pos,0) & 0x3f) != 0x11 || ((ptVar11->field_2).special != 0x117));
            ptVar11 = ptVar11->next) {
          psVar9 = dmrC_alloc_symbol(C->S,ptVar11->pos,3);
          local_58 = (symbol_op *)0x0;
          local_68 = (symbol *)0x0;
          ppiStack_60 = (ident **)0x0;
          _local_78 = (context_list *)0x0;
          uStack_70 = 0;
          uStack_6c = 0;
          _uStack_88 = (expression *)0x0;
          expr = (expression *)0x0;
          uStack_50 = '\x01';
          uStack_4f = '\0';
          bStack_4e = '\0';
          uStack_4d = '\0';
          uStack_4c = 0;
          ptVar11 = declaration_specifiers(C,ptVar11,(decl_state *)&stack0xffffffffffffff78);
          ppiStack_60 = &psVar9->ident;
          ptVar11 = declarator(C,ptVar11,(decl_state *)&stack0xffffffffffffff78);
          ptVar11 = handle_attributes(C,ptVar11,(decl_state *)&stack0xffffffffffffff78,8);
          apply_modifiers(C,ptVar11->pos,(decl_state *)&stack0xffffffffffffff78);
          (psVar9->field_14).field_2.ctype.base_type = local_68;
          *(undefined4 *)((long)&psVar9->field_14 + 0x28) = local_78;
          *(undefined4 *)((long)&psVar9->field_14 + 0x2c) = uStack_74;
          *(uint *)((long)&psVar9->field_14 + 0x30) = uStack_70;
          *(undefined4 *)((long)&psVar9->field_14 + 0x34) = uStack_6c;
          *(undefined4 *)((long)&psVar9->field_14 + 0x18) = uStack_88;
          *(undefined4 *)((long)&psVar9->field_14 + 0x1c) = uStack_84;
          *(undefined4 *)((long)&psVar9->field_14 + 0x20) = expr._0_4_;
          *(undefined4 *)((long)&psVar9->field_14 + 0x24) = expr._4_4_;
          (psVar9->field_14).field_2.ctype.modifiers =
               (ulong)(uStack_4f != '\0') << 0x12 |
               *(ulong *)(storage_modifiers_mod + (ulong)bStack_4e * 8) |
               (psVar9->field_14).field_2.ctype.modifiers | (ulong)(uStack_4d != '\0') << 0x11;
          psVar9->endpos = ptVar11->pos;
          *(uint *)((long)&psVar9->field_14 + 0xc) =
               *(uint *)((long)&psVar9->field_14 + 0xc) & 0xfdffffff |
               (uint)(bStack_4e == 6) << 0x19;
          if ((psVar9->field_14).field_2.ctype.base_type == &C->S->void_ctype) {
            if ((local_38->number == (char *)0x0) && (psVar9->ident == (ident *)0x0))
            goto LAB_00118933;
            dmrC_warning(C,ptVar11->pos,"void parameter");
          }
          ptrlist_add((ptr_list **)&local_38->ident,psVar9,&C->ptrlist_allocator);
          if ((((ulong)ptVar11->pos & 0x3f) != 0x11) || ((ptVar11->field_2).special != 0x2c))
          goto LAB_00118933;
        }
        pbVar1 = (byte *)((long)&local_48->field_14 + 0xe);
        *pbVar1 = *pbVar1 | 4;
        ptVar11 = ptVar11->next;
      }
      else if (iVar8 == 1) {
        paVar6 = &local_48->field_14;
        while( true ) {
          psVar9 = dmrC_alloc_symbol(C->S,ptVar11->pos,3);
          psVar9->ident = (ident *)ptVar11->field_2;
          ptVar11 = ptVar11->next;
          psVar9->endpos = ptVar11->pos;
          (psVar9->field_14).field_2.ctype.base_type = &C->S->incomplete_ctype;
          ptrlist_add((ptr_list **)&(paVar6->field_2).arguments,psVar9,&C->ptrlist_allocator);
          if ((((((ulong)ptVar11->pos & 0x3f) != 0x11) || ((ptVar11->field_2).special != 0x2c)) ||
              (((ulong)ptVar11->next->pos & 0x3f) != 2)) ||
             ((psVar9 = dmrC_lookup_symbol((ptVar11->next->field_2).ident,NS_SYMBOL|NS_TYPEDEF),
              psVar9 != (symbol *)0x0 && ((psVar9->field_0x1 & 2) != 0)))) break;
          ptVar11 = ptVar11->next;
        }
      }
LAB_00118933:
      token = dmrC_expect_token(C,ptVar11,0x29,"in function declarator");
      local_48->endpos = token->pos;
    }
    else {
      do {
        if ((token->field_2).special != 0x5b) {
          return token;
        }
        psVar9 = dmrC_alloc_symbol(C->S,pVar12,6);
        (psVar9->field_14).field_2.ctype.base_type = (pdVar16->ctype).base_type;
        (psVar9->field_14).field_2.ctype.modifiers = (pdVar16->ctype).modifiers;
        (pdVar16->ctype).base_type = psVar9;
        (pdVar16->ctype).modifiers = 0;
        _uStack_88 = (expression *)0x0;
        local_3c = 0;
        C_00 = C;
        ptVar11 = abstract_array_static_declarator(C,token->next,&local_3c);
        pgVar4 = C->S;
        iVar8 = match_idents(C_00,ptVar11,pgVar4->restrict_ident,pgVar4->__restrict_ident,
                             pgVar4->__restrict___ident,0);
        if (iVar8 != 0) {
          ptVar11 = abstract_array_static_declarator(C,ptVar11->next,&local_3c);
        }
        pdVar16 = (decl_state *)&(psVar9->field_14).field_2.ctype;
        ptVar11 = dmrC_parse_expression(C,ptVar11,(expression **)&stack0xffffffffffffff78);
        (psVar9->field_14).field_0.used_in = (scope *)_uStack_88;
        token = dmrC_expect_token(C,ptVar11,0x5d,"in abstract_array_declarator");
        psVar9->endpos = token->pos;
        pVar12 = token->pos;
      } while ((pVar12._0_4_ & 0x3f) == 0x11);
    }
  }
  return token;
}

Assistant:

static struct token *declarator(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	token = pointer(C, token, ctx);
	return direct_declarator(C, token, ctx);
}